

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

set_entry * set_search(set *ht,uint32_t hash,void *key)

{
  uint uVar1;
  uint32_t *puVar2;
  _Bool _Var3;
  uint uVar4;
  uint32_t b0;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  set_entry *psVar9;
  
  if ((key == (void *)0x0) || ((uint32_t *)key == &deleted_key_value)) {
    __assert_fail("!key_pointer_is_reserved(key)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/set.c"
                  ,0xdf,"struct set_entry *set_search(const struct set *, uint32_t, const void *)");
  }
  uVar1 = ht->size;
  uVar5 = ht->size_magic * (ulong)hash;
  uVar6 = (uint)((uVar5 >> 0x20) * (ulong)uVar1 + ((uVar5 & 0xffffffff) * (ulong)uVar1 >> 0x20) >>
                0x20);
  if ((hash % uVar1 == uVar6) &&
     (uVar7 = ht->rehash, uVar5 = (ulong)hash * ht->rehash_magic,
     uVar8 = (uint)((uVar5 >> 0x20) * (ulong)uVar7 + ((uVar5 & 0xffffffff) * (ulong)uVar7 >> 0x20)
                   >> 0x20), hash % uVar7 == uVar8)) {
    uVar7 = uVar6;
    while( true ) {
      puVar2 = (uint32_t *)ht->table[uVar7].key;
      if (puVar2 == (uint32_t *)0x0) {
        return (set_entry *)0x0;
      }
      if (((puVar2 != &deleted_key_value) && (psVar9 = ht->table + uVar7, psVar9->hash == hash)) &&
         (_Var3 = (*ht->key_equals_function)(key,puVar2), _Var3)) break;
      uVar7 = uVar7 + uVar8 + 1;
      uVar4 = uVar1;
      if (uVar7 < uVar1) {
        uVar4 = 0;
      }
      uVar7 = uVar7 - uVar4;
      if (uVar7 == uVar6) {
        return (set_entry *)0x0;
      }
    }
    return psVar9;
  }
  __assert_fail("result == n % d",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/fast_urem_by_const.h"
                ,0x47,"uint32_t util_fast_urem32(uint32_t, uint32_t, uint64_t)");
}

Assistant:

static struct set_entry *
set_search(const struct set *ht, uint32_t hash, const void *key)
{
   assert(!key_pointer_is_reserved(key));

   uint32_t size = ht->size;
   uint32_t start_address = util_fast_urem32(hash, size, ht->size_magic);
   uint32_t double_hash = util_fast_urem32(hash, ht->rehash,
                                           ht->rehash_magic) + 1;
   uint32_t hash_address = start_address;
   do {
      struct set_entry *entry = ht->table + hash_address;

      if (entry_is_free(entry)) {
         return NULL;
      } else if (entry_is_present(entry) && entry->hash == hash) {
         if (ht->key_equals_function(key, entry->key)) {
            return entry;
         }
      }

      hash_address += double_hash;
      if (hash_address >= size)
         hash_address -= size;
   } while (hash_address != start_address);

   return NULL;
}